

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5500b::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::gemmMx4<2>
          (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  ulong uVar4;
  float *pfVar5;
  block_q8_0 *pbVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 *puVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint8_t *__return_storage_ptr__;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m256 Cv [4] [2];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  lVar9 = (n - n0) / 4;
  lVar16 = ((m - m0) / 2) * lVar9;
  lVar10 = (lVar16 + -1 + (long)this->nth) / (long)this->nth;
  lVar13 = this->ith * lVar10;
  lVar10 = lVar10 + lVar13;
  if (lVar16 <= lVar10) {
    lVar10 = lVar16;
  }
  uVar4 = this->k;
  lVar16 = this->ldc * 4;
  pfVar5 = this->C;
  while( true ) {
    if (lVar10 <= lVar13) {
      return;
    }
    local_c0 = ZEXT1664(ZEXT816(0) << 0x40);
    lVar14 = lVar13 % lVar9;
    local_100 = local_c0;
    local_140 = local_c0;
    local_180 = local_c0;
    lVar15 = this->ldb;
    lVar11 = n0 + lVar14 * 4;
    pbVar6 = this->B;
    __return_storage_ptr__ = this->A->qh + (m0 + (lVar13 / lVar9) * 2) * this->lda * 0x16 + -2;
    if ((~((long)uVar4 >> 0x3f) & uVar4) != 0) break;
    lVar11 = (long)pfVar5 + lVar11 * lVar16 + (lVar13 / lVar9) * 8 + m0 * 4;
    puVar12 = local_180;
    for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 4) {
        pfVar2 = (float *)(puVar12 + lVar14 * 8 + 0x10);
        pfVar1 = (float *)(puVar12 + lVar14 * 8);
        auVar17._0_4_ = *pfVar2 + *pfVar1;
        auVar17._4_4_ = pfVar2[1] + pfVar1[1];
        auVar17._8_4_ = pfVar2[2] + pfVar1[2];
        auVar17._12_4_ = pfVar2[3] + pfVar1[3];
        auVar7 = vshufpd_avx(auVar17,auVar17,1);
        auVar18._0_4_ = auVar17._0_4_ + auVar7._0_4_;
        auVar18._4_4_ = auVar17._4_4_ + auVar7._4_4_;
        auVar18._8_4_ = auVar17._8_4_ + auVar7._8_4_;
        auVar18._12_4_ = auVar17._12_4_ + auVar7._12_4_;
        auVar7 = vhaddps_avx(auVar18,auVar18);
        *(int *)(lVar11 + lVar14) = auVar7._0_4_;
      }
      lVar11 = lVar11 + lVar16;
      puVar12 = puVar12 + 0x40;
    }
    lVar13 = lVar13 + 1;
  }
  auVar7 = vpinsrw_avx(ZEXT216(pbVar6[lVar15 * lVar11].d),
                       (uint)*(ushort *)
                              &((tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)
                               (pbVar6 + (n0 + 1 + lVar14 * 4) * lVar15))->A,1);
  auVar7 = vpinsrw_avx(auVar7,(uint)pbVar6[(n0 + 2 + lVar14 * 4) * lVar15].d,2);
  auVar7 = vpinsrw_avx(auVar7,(uint)pbVar6[(n0 + 3 + lVar14 * 4) * lVar15].d,3);
  auVar7 = vcvtph2ps_f16c(auVar7);
  uVar3 = *(undefined4 *)(&ggml_table_f32_f16 + (ulong)*(ushort *)__return_storage_ptr__ * 4);
  auVar8._4_4_ = uVar3;
  auVar8._0_4_ = uVar3;
  auVar8._8_4_ = uVar3;
  auVar8._12_4_ = uVar3;
  vmulps_avx512vl(auVar7,auVar8);
  load((__m256i *)__return_storage_ptr__,
       (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)(pbVar6 + (n0 + 1 + lVar14 * 4) * lVar15),
       (block_q5_0 *)(pbVar6 + (n0 + 2 + lVar14 * 4) * lVar15));
}

Assistant:

NOINLINE void gemmMx4(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / 4;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * 4;
            __m256 Cv[4][RM] = {};
            for (int64_t l = 0; l < k; ++l) {
                uint64_t b_delta = ((uint64_t)B[ldb * (jj + 3) + l].d << 48) | ((uint64_t)B[ldb * (jj + 2) + l].d << 32) | ((uint64_t)B[ldb * (jj + 1) + l].d << 16) | (B[ldb * (jj + 0) + l].d);
                // Convert delta values for four blocks to float values
                __m128 db = _mm_cvtph_ps(_mm_set_epi64x(0, b_delta));
                __m256i bvec0 = load(B + ldb * (jj + 0) + l);
                __m256i bvec1 = load(B + ldb * (jj + 1) + l);
                __m256i bvec2 = load(B + ldb * (jj + 2) + l);
                __m256i bvec3 = load(B + ldb * (jj + 3) + l);
                for (int64_t i = 0; i < RM; ++i) {
                    __m128 da = _mm_set1_ps(unhalf((A[lda * (ii + i) + l].d)));
                    // Computation of product of delta values for four blocks and replicate it across 256 bit lane
                    __m256 dvec =  _mm256_castps128_ps256(_mm_mul_ps(da, db));
                    dvec = _mm256_permute2f128_ps(dvec ,dvec, 0);
                    // Computation of dot product and multiplication with appropriate delta value products
                    Cv[0][i] = madd(_mm256_shuffle_ps(dvec, dvec, 0),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec0, load(A + lda * (ii + i) + l))),
                                    Cv[0][i]);
                    Cv[1][i] = madd(_mm256_shuffle_ps(dvec, dvec, 85),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec1, load(A + lda * (ii + i) + l))),
                                    Cv[1][i]);
                    Cv[2][i] = madd(_mm256_shuffle_ps(dvec, dvec, 170),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec2, load(A + lda * (ii + i) + l))),
                                    Cv[2][i]);
                    Cv[3][i] = madd(_mm256_shuffle_ps(dvec, dvec, 255),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec3, load(A + lda * (ii + i) + l))),
                                    Cv[3][i]);
                }
            }
            for (int64_t j = 0; j < 4; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }